

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb99.c
# Opt level: O1

err_t stb99DiVal(stb99_seed *seed,size_t r)

{
  long lVar1;
  ulong uVar2;
  
  uVar2 = seed->di[0];
  if (((uVar2 < 0x1fffffffffffffff) && (seed->l <= uVar2 * 2)) && (uVar2 << 3 <= seed->l * 7 - r)) {
    lVar1 = 10;
    do {
      uVar2 = *(ulong *)(seed->zi + lVar1 * 4 + -4);
      if (uVar2 < 0x11) {
        uVar2 = lVar1 - 9;
        goto LAB_00143374;
      }
      if (0x3333333333333332 < uVar2) {
        return 0x20c;
      }
      if (uVar2 * 2 < *(ulong *)(seed->zi + lVar1 * 4 + -8)) {
        return 0x20c;
      }
      if (*(ulong *)(seed->zi + lVar1 * 4 + -8) * 4 - 0x10 <= uVar2 * 5) {
        return 0x20c;
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x1b);
    uVar2 = 0x12;
LAB_00143374:
    if (seed->di[uVar2 - 1] < 0x21) {
      if (uVar2 < 0x12) {
        lVar1 = uVar2 + 9;
        do {
          if (*(long *)(seed->zi + lVar1 * 4 + -4) != 0) {
            return 0x20c;
          }
          lVar1 = lVar1 + 1;
        } while (lVar1 != 0x1b);
      }
      return 0;
    }
  }
  return 0x20c;
}

Assistant:

static err_t stb99DiVal(const stb99_seed* seed, size_t r)
{
	size_t i;
	// проверить di[0]
	ASSERT(7 * seed->l > r);
	if (seed->di[0] >= SIZE_MAX / 8 ||
		seed->l > 2 * seed->di[0] ||
		8 * seed->di[0] > 7 * seed->l - r)
		return ERR_BAD_SEED;
	ASSERT(seed->di[0] > 16);
	// проверить цепочку di
	for (i = 1; i < COUNT_OF(seed->di) && seed->di[i] > 16; ++i)
		if (seed->di[i] >= SIZE_MAX / 5 ||
			seed->di[i - 1] > 2 * seed->di[i] ||
			5 * seed->di[i] >= 4 * seed->di[i - 1] - 16)
			return ERR_BAD_SEED;
	if (seed->di[i - 1] > 32)
		return ERR_BAD_SEED;
	for (; i < COUNT_OF(seed->di); ++i)
		if (seed->di[i] != 0)
			return ERR_BAD_SEED;
	// все хорошо
	return ERR_OK;
}